

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::setSpriteBank(CGUIListBox *this,IGUISpriteBank *bank)

{
  IGUISpriteBank *pIVar1;
  
  pIVar1 = this->IconBank;
  if (pIVar1 != bank) {
    if (pIVar1 != (IGUISpriteBank *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar1->_vptr_IGUISpriteBank + (long)pIVar1->_vptr_IGUISpriteBank[-3]));
    }
    this->IconBank = bank;
    if (bank != (IGUISpriteBank *)0x0) {
      *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) =
           *(int *)(&bank->field_0x10 + (long)bank->_vptr_IGUISpriteBank[-3]) + 1;
    }
  }
  return;
}

Assistant:

void CGUIListBox::setSpriteBank(IGUISpriteBank *bank)
{
	if (bank == IconBank)
		return;
	if (IconBank)
		IconBank->drop();

	IconBank = bank;
	if (IconBank)
		IconBank->grab();
}